

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpFileInfo.c
# Opt level: O0

int UpnpFileInfo_assign(UpnpFileInfo *p,UpnpFileInfo *q)

{
  int iVar1;
  off_t n;
  time_t n_00;
  char *s;
  UpnpListHead *q_00;
  sockaddr_storage *buf;
  UpnpString *s_00;
  bool bVar2;
  bool bVar3;
  undefined1 local_89;
  undefined4 local_1c;
  int ok;
  UpnpFileInfo *q_local;
  UpnpFileInfo *p_local;
  
  local_1c = 1;
  if (p != q) {
    n = UpnpFileInfo_get_FileLength(q);
    iVar1 = UpnpFileInfo_set_FileLength(p,n);
    bVar2 = false;
    if (iVar1 != 0) {
      n_00 = UpnpFileInfo_get_LastModified(q);
      iVar1 = UpnpFileInfo_set_LastModified(p,n_00);
      bVar2 = iVar1 != 0;
    }
    bVar3 = false;
    if (bVar2) {
      iVar1 = UpnpFileInfo_get_IsDirectory(q);
      iVar1 = UpnpFileInfo_set_IsDirectory(p,iVar1);
      bVar3 = iVar1 != 0;
    }
    bVar2 = false;
    if (bVar3) {
      iVar1 = UpnpFileInfo_get_IsReadable(q);
      iVar1 = UpnpFileInfo_set_IsReadable(p,iVar1);
      bVar2 = iVar1 != 0;
    }
    bVar3 = false;
    if (bVar2) {
      s = UpnpFileInfo_get_ContentType(q);
      iVar1 = UpnpFileInfo_set_ContentType(p,s);
      bVar3 = iVar1 != 0;
    }
    bVar2 = false;
    if (bVar3) {
      q_00 = UpnpFileInfo_get_ExtraHeadersList(q);
      iVar1 = UpnpFileInfo_set_ExtraHeadersList(p,q_00);
      bVar2 = iVar1 != 0;
    }
    bVar3 = false;
    if (bVar2) {
      buf = UpnpFileInfo_get_CtrlPtIPAddr(q);
      iVar1 = UpnpFileInfo_set_CtrlPtIPAddr(p,buf);
      bVar3 = iVar1 != 0;
    }
    local_89 = false;
    if (bVar3) {
      s_00 = UpnpFileInfo_get_Os(q);
      iVar1 = UpnpFileInfo_set_Os(p,s_00);
      local_89 = iVar1 != 0;
    }
    local_1c = (uint)local_89;
  }
  return local_1c;
}

Assistant:

int UpnpFileInfo_assign(UpnpFileInfo *p, const UpnpFileInfo *q)
{
	int ok = 1;

	if (p != q) {
		ok = ok && UpnpFileInfo_set_FileLength(
				   p, UpnpFileInfo_get_FileLength(q));
		ok = ok && UpnpFileInfo_set_LastModified(
				   p, UpnpFileInfo_get_LastModified(q));
		ok = ok && UpnpFileInfo_set_IsDirectory(
				   p, UpnpFileInfo_get_IsDirectory(q));
		ok = ok && UpnpFileInfo_set_IsReadable(
				   p, UpnpFileInfo_get_IsReadable(q));
		ok = ok && UpnpFileInfo_set_ContentType(
				   p, UpnpFileInfo_get_ContentType(q));
		ok = ok && UpnpFileInfo_set_ExtraHeadersList(
				   p, UpnpFileInfo_get_ExtraHeadersList(q));
		ok = ok && UpnpFileInfo_set_CtrlPtIPAddr(
				   p, UpnpFileInfo_get_CtrlPtIPAddr(q));
		ok = ok && UpnpFileInfo_set_Os(p, UpnpFileInfo_get_Os(q));
	}

	return ok;
}